

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O2

void cftf082(double *a,double *w)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar5;
  undefined1 auVar4 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  
  dVar2 = w[1];
  dVar21 = a[2] - a[0xb];
  dVar19 = a[3] + a[10];
  auVar1 = *(undefined1 (*) [16])(w + 2);
  dVar3 = a[1] - a[8];
  dVar5 = *a - a[9];
  dVar8 = a[1] + a[8];
  dVar9 = *a + a[9];
  dVar14 = a[5] + a[0xc];
  dVar16 = a[4] + a[0xd];
  dVar11 = a[4] - a[0xd];
  dVar13 = a[5] - a[0xc];
  dVar20 = (dVar11 - dVar14) * dVar2;
  dVar7 = (dVar16 - dVar13) * dVar2;
  dVar14 = dVar2 * (dVar11 + dVar14);
  dVar2 = dVar2 * (dVar13 + dVar16);
  dVar13 = auVar1._8_8_;
  dVar11 = auVar1._0_8_;
  dVar12 = dVar11 * dVar19 + dVar13 * dVar21;
  dVar10 = a[6] - a[0xf];
  dVar24 = a[7] + a[0xe];
  dVar15 = dVar13 * dVar24 + dVar11 * dVar10;
  dVar17 = a[0xb] + a[2];
  dVar18 = a[0xf] + a[6];
  dVar16 = a[3] - a[10];
  dVar6 = a[7] - a[0xe];
  auVar4._8_4_ = auVar1._0_4_;
  auVar4._0_8_ = dVar13;
  auVar4._12_4_ = auVar1._4_4_;
  dVar22 = dVar21 * dVar11 + SUB168(auVar4 ^ _DAT_0010c380,0) * dVar19;
  dVar23 = dVar17 * dVar13 + SUB168(auVar4 ^ _DAT_0010c380,8) * dVar16;
  dVar19 = dVar10 * dVar13 - dVar24 * dVar11;
  dVar21 = dVar18 * dVar11 - dVar6 * dVar13;
  dVar10 = dVar16 * dVar13 + dVar17 * dVar11;
  dVar13 = dVar6 * dVar11 + dVar18 * dVar13;
  dVar11 = dVar5 + dVar20;
  dVar16 = dVar8 + dVar14;
  dVar6 = dVar22 + dVar19;
  dVar17 = dVar12 + dVar15;
  *a = dVar11 + dVar6;
  a[1] = dVar16 + dVar17;
  a[2] = dVar11 - dVar6;
  a[3] = dVar16 - dVar17;
  dVar5 = dVar5 - dVar20;
  dVar12 = dVar12 - dVar15;
  a[4] = dVar5 - dVar12;
  dVar8 = dVar8 - dVar14;
  dVar16 = dVar9 - dVar2;
  dVar22 = dVar22 - dVar19;
  dVar6 = dVar23 - dVar21;
  a[5] = dVar8 + dVar22;
  a[6] = dVar12 + dVar5;
  dVar11 = dVar3 + dVar7;
  a[7] = dVar8 - dVar22;
  a[8] = dVar16 + dVar6;
  dVar14 = dVar10 - dVar13;
  a[9] = dVar11 + dVar14;
  a[10] = dVar16 - dVar6;
  a[0xb] = dVar11 - dVar14;
  dVar3 = dVar3 - dVar7;
  dVar13 = dVar13 + dVar10;
  dVar2 = dVar2 + dVar9;
  dVar21 = dVar21 + dVar23;
  a[0xc] = dVar2 - dVar13;
  a[0xd] = dVar3 + dVar21;
  a[0xe] = dVar13 + dVar2;
  a[0xf] = dVar3 - dVar21;
  return;
}

Assistant:

void cftf082(double *a, double *w) {
  double wn4r, wk1r, wk1i, x0r, x0i, x1r, x1i,
    y0r, y0i, y1r, y1i, y2r, y2i, y3r, y3i,
    y4r, y4i, y5r, y5i, y6r, y6i, y7r, y7i;

  wn4r = w[1];
  wk1r = w[2];
  wk1i = w[3];
  y0r = a[0] - a[9];
  y0i = a[1] + a[8];
  y1r = a[0] + a[9];
  y1i = a[1] - a[8];
  x0r = a[4] - a[13];
  x0i = a[5] + a[12];
  y2r = wn4r * (x0r - x0i);
  y2i = wn4r * (x0i + x0r);
  x0r = a[4] + a[13];
  x0i = a[5] - a[12];
  y3r = wn4r * (x0r - x0i);
  y3i = wn4r * (x0i + x0r);
  x0r = a[2] - a[11];
  x0i = a[3] + a[10];
  y4r = wk1r * x0r - wk1i * x0i;
  y4i = wk1r * x0i + wk1i * x0r;
  x0r = a[2] + a[11];
  x0i = a[3] - a[10];
  y5r = wk1i * x0r - wk1r * x0i;
  y5i = wk1i * x0i + wk1r * x0r;
  x0r = a[6] - a[15];
  x0i = a[7] + a[14];
  y6r = wk1i * x0r - wk1r * x0i;
  y6i = wk1i * x0i + wk1r * x0r;
  x0r = a[6] + a[15];
  x0i = a[7] - a[14];
  y7r = wk1r * x0r - wk1i * x0i;
  y7i = wk1r * x0i + wk1i * x0r;
  x0r = y0r + y2r;
  x0i = y0i + y2i;
  x1r = y4r + y6r;
  x1i = y4i + y6i;
  a[0] = x0r + x1r;
  a[1] = x0i + x1i;
  a[2] = x0r - x1r;
  a[3] = x0i - x1i;
  x0r = y0r - y2r;
  x0i = y0i - y2i;
  x1r = y4r - y6r;
  x1i = y4i - y6i;
  a[4] = x0r - x1i;
  a[5] = x0i + x1r;
  a[6] = x0r + x1i;
  a[7] = x0i - x1r;
  x0r = y1r - y3i;
  x0i = y1i + y3r;
  x1r = y5r - y7r;
  x1i = y5i - y7i;
  a[8] = x0r + x1r;
  a[9] = x0i + x1i;
  a[10] = x0r - x1r;
  a[11] = x0i - x1i;
  x0r = y1r + y3i;
  x0i = y1i - y3r;
  x1r = y5r + y7r;
  x1i = y5i + y7i;
  a[12] = x0r - x1i;
  a[13] = x0i + x1r;
  a[14] = x0r + x1i;
  a[15] = x0i - x1r;
}